

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkDescriptorSetLayout_T ** __thiscall
Fossilize::StateRecorder::Impl::copy<VkDescriptorSetLayout_T*>
          (Impl *this,VkDescriptorSetLayout_T **src,size_t count,ScratchAllocator *alloc)

{
  VkDescriptorSetLayout_T **ppVVar1;
  
  if (count != 0) {
    ppVVar1 = ScratchAllocator::allocate_n<VkDescriptorSetLayout_T*>(alloc,count);
    if (ppVVar1 != (VkDescriptorSetLayout_T **)0x0) {
      ppVVar1 = (VkDescriptorSetLayout_T **)memmove(ppVVar1,src,count << 3);
      return ppVVar1;
    }
  }
  return (VkDescriptorSetLayout_T **)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}